

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

Split * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::find(Split *__return_storage_ptr__,
      BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::InstanceArray>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>,_embree::Scene::BuildProgressMonitorInterface>
      *this,SetMB *set)

{
  size_t logBlockSize;
  float fVar1;
  byte bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Split object_split;
  Split local_68;
  
  HeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::find
            (&local_68,(HeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *)&this->field_0x40,set,
             (this->cfg).logBlockSize);
  fVar1 = local_68.sah;
  logBlockSize = (this->cfg).logBlockSize;
  fVar3 = (set->super_PrimInfoMB).time_range.upper - (set->super_PrimInfoMB).time_range.lower;
  fVar6 = (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
          upper.field_0.m128[1] -
          (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
          lower.field_0.m128[1];
  fVar7 = (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
          upper.field_0.m128[2] -
          (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
          lower.field_0.m128[2];
  fVar4 = (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
          upper.field_0.m128[1] -
          (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
          lower.field_0.m128[1];
  fVar5 = (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
          upper.field_0.m128[2] -
          (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
          lower.field_0.m128[2];
  bVar2 = (byte)logBlockSize;
  if (((local_68.sah <
        (((set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
          upper.field_0.m128[0] -
         (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
         lower.field_0.m128[0]) * (fVar4 + fVar5) + fVar5 * fVar4 +
        ((set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
         upper.field_0.m128[0] -
        (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
        lower.field_0.m128[0]) * (fVar6 + fVar7) + fVar7 * fVar6) * 0.5 * fVar3 *
        (float)(~(-1L << (bVar2 & 0x3f)) + (set->super_PrimInfoMB).num_time_segments >>
               (bVar2 & 0x3f)) * 0.5) ||
      (fVar3 <= 1.01 / (float)(set->super_PrimInfoMB).max_num_time_segments)) ||
     (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::InstanceArray>,_2UL>
      ::find(__return_storage_ptr__,&this->heuristicTemporalSplit,set,logBlockSize),
     fVar1 < __return_storage_ptr__->sah || fVar1 == __return_storage_ptr__->sah)) {
    __return_storage_ptr__->sah = local_68.sah;
    __return_storage_ptr__->dim = local_68.dim;
    __return_storage_ptr__->field_2 = local_68.field_2;
    __return_storage_ptr__->data = local_68.data;
    (__return_storage_ptr__->mapping).num = local_68.mapping.num;
    *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 =
         local_68.mapping.ofs.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) =
         local_68.mapping.ofs.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 =
         local_68.mapping.scale.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
         local_68.mapping.scale.field_0._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

const Split find(const SetMB& set)
          {
            /* first try standard object split */
            const Split object_split = heuristicObjectSplit.find(set,cfg.logBlockSize);
            const float object_split_sah = object_split.splitSAH();

            /* test temporal splits only when object split was bad */
            const float leaf_sah = set.leafSAH(cfg.logBlockSize);
            if (object_split_sah < 0.50f*leaf_sah)
              return object_split;

            /* do temporal splits only if the time range is big enough */
            if (set.time_range.size() > 1.01f/float(set.max_num_time_segments))
            {
              const Split temporal_split = heuristicTemporalSplit.find(set,cfg.logBlockSize);
              const float temporal_split_sah = temporal_split.splitSAH();

              /* take temporal split if it improved SAH */
              if (temporal_split_sah < object_split_sah)
                return temporal_split;
            }

            return object_split;
          }